

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.h
# Opt level: O2

QImage * __thiscall QImage::convertToFormat(QImage *this,Format f,ImageConversionFlags flags)

{
  char cVar1;
  undefined4 in_ECX;
  undefined4 in_register_00000034;
  QImage *other;
  
  other = (QImage *)CONCAT44(in_register_00000034,f);
  cVar1 = ::QImage::convertToFormat_inplace
                    (other,flags.super_QFlagsStorageHelper<Qt::ImageConversionFlag,_4>.
                           super_QFlagsStorage<Qt::ImageConversionFlag>.i,in_ECX);
  if (cVar1 == '\0') {
    ::QImage::convertToFormat_helper
              (this,other,
               flags.super_QFlagsStorageHelper<Qt::ImageConversionFlag,_4>.
               super_QFlagsStorage<Qt::ImageConversionFlag>.i,in_ECX);
  }
  else {
    QImage(this,other);
  }
  return this;
}

Assistant:

[[nodiscard]] QImage convertToFormat(Format f, Qt::ImageConversionFlags flags = Qt::AutoColor) &&
    {
        if (convertToFormat_inplace(f, flags))
            return std::move(*this);
        else
            return convertToFormat_helper(f, flags);
    }